

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer paVar1;
  _func_int **pp_Var2;
  float fVar3;
  float fVar4;
  aiMesh *paVar5;
  pointer __src;
  bool bVar6;
  uint i;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  IrrXMLReader *pIVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Logger *pLVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  aiMesh *paVar14;
  undefined4 extraout_var_04;
  ulong *puVar15;
  aiVector3D *paVar16;
  aiColor4D *__s;
  char *s2;
  uint *puVar17;
  aiMesh **ppaVar18;
  aiMaterial **__dest;
  aiNode *this_00;
  DeadlyImportError *pDVar19;
  aiFace *paVar20;
  aiFace *paVar21;
  ulong uVar22;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_01;
  ulong uVar23;
  size_type __n;
  aiVector3D *paVar24;
  float *out;
  aiVector3D *paVar25;
  IrrlichtBase *this_02;
  aiVector3D *paVar26;
  long lVar27;
  float fVar28;
  char *sz;
  value_type local_218;
  aiMesh *curMesh;
  aiMaterial *curMat;
  int local_1f4;
  uint local_1f0;
  uint curMatFlags;
  aiColor4D *local_1e8;
  uint local_1dc;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  aiVector3D *local_198;
  aiVector3D *local_190;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  int idx;
  float fStack_c4;
  size_type sStack_c0;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  CIrrXML_IOStreamReader st;
  IOStream *_stream;
  undefined4 extraout_var_05;
  
  std::__cxx11::string::string((string *)&st,"rb",(allocator *)&idx);
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     st.super_IFileReadCallBack._vptr_IFileReadCallBack);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::string::~string((string *)&st);
  if (_stream == (IOStream *)0x0) {
    pDVar19 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                   "Failed to open IRRMESH file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,"");
    DeadlyImportError::DeadlyImportError(pDVar19,(string *)&st);
    __cxa_throw(pDVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(&st,_stream);
  pIVar12 = irr::io::createIrrXMLReader(&st.super_IFileReadCallBack);
  (this->super_IrrlichtBase).reader = pIVar12;
  materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(&materials,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&meshes,5);
  this_02 = &this->super_IrrlichtBase;
  curMat = (aiMaterial *)0x0;
  curMesh = (aiMesh *)0x0;
  curMatFlags = 0;
  curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = 0;
  iVar7 = 0;
  iVar8 = 0;
LAB_004148ff:
  do {
    local_1f4 = iVar8;
LAB_00414903:
    out = &local_218.y;
    iVar8 = (*this_02->reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar8 == '\0') {
      if (curMat != (aiMaterial *)0x0 || curMesh != (aiMesh *)0x0) {
        if (curMat == (aiMaterial *)0x0 || curMesh == (aiMesh *)0x0) {
          pLVar13 = DefaultLogger::get();
          Logger::error(pLVar13,"IRRMESH: A buffer must contain a mesh and a material");
          releaseMaterial(&curMat);
          releaseMesh(&curMesh);
        }
        else {
          std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&materials,&curMat);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&curMesh);
        }
      }
      if (materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pDVar19 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&idx,"IRRMESH: Unable to read a mesh from this file",
                   (allocator *)&local_218);
        DeadlyImportError::DeadlyImportError(pDVar19,(string *)&idx);
        __cxa_throw(pDVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar22 = (ulong)((long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
      pScene->mNumMeshes = (uint)uVar22;
      ppaVar18 = (aiMesh **)
                 operator_new__((long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
      __src = materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      pScene->mMeshes = ppaVar18;
      for (uVar23 = 0; uVar23 < (uVar22 & 0xffffffff); uVar23 = uVar23 + 1) {
        pScene->mMeshes[uVar23] =
             meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar23];
        pScene->mMeshes[uVar23]->mNumUVComponents[3] = 0;
        uVar22 = (ulong)pScene->mNumMeshes;
      }
      pScene->mNumMaterials =
           (uint)((ulong)((long)materials.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)materials.
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar23 = (long)materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
      __dest = (aiMaterial **)operator_new__(uVar23);
      pScene->mMaterials = __dest;
      memcpy(__dest,__src,uVar23);
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode = this_00;
      aiString::Set((aiString *)this_00,"<IRRMesh>");
      uVar10 = pScene->mNumMeshes;
      pScene->mRootNode->mNumMeshes = uVar10;
      puVar17 = (uint *)operator_new__((ulong)uVar10 << 2);
      pScene->mRootNode->mMeshes = puVar17;
      for (uVar23 = 0; uVar23 < pScene->mNumMeshes; uVar23 = uVar23 + 1) {
        pScene->mRootNode->mMeshes[uVar23] = (uint)uVar23;
      }
      if (this_02->reader != (IrrXMLReader *)0x0) {
        (*this_02->reader->_vptr_IIrrXMLReader[1])();
      }
      this_02->reader = (IrrXMLReader *)0x0;
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                );
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
      ;
      std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
                (&curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                );
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curBitangents.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curTangents.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curNormals.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&curVertices.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
                (&materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
      CIrrXML_IOStreamReader::~CIrrXML_IOStreamReader(&st);
      (*_stream->_vptr_IOStream[1])();
      return;
    }
    iVar9 = (*this_02->reader->_vptr_IIrrXMLReader[3])();
    if (iVar9 != 1) {
      iVar8 = local_1f4;
      if (iVar9 != 3) goto LAB_004148ff;
      iVar8 = (*this_02->reader->_vptr_IIrrXMLReader[0xe])();
      sz = (char *)CONCAT44(extraout_var_04,iVar8);
      if (iVar7 == 2) {
        paVar21 = curMesh->mFaces;
        paVar20 = paVar21 + curMesh->mNumFaces;
        paVar24 = curMesh->mVertices;
        paVar16 = curMesh->mNormals;
        paVar26 = curMesh->mTangents;
        paVar25 = curMesh->mBitangents;
        local_1e8 = curMesh->mColors[0];
        local_190 = curMesh->mTextureCoords[0];
        local_198 = curMesh->mTextureCoords[1];
        uVar10 = 0;
        local_1dc = 0;
        break;
      }
      iVar8 = local_1f4;
      if (iVar7 != 1) goto LAB_004148ff;
      goto LAB_00414bfa;
    }
    iVar8 = (*this_02->reader->_vptr_IIrrXMLReader[0xd])();
    iVar8 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar8),"buffer");
    if ((iVar8 == 0) && (curMat != (aiMaterial *)0x0 || curMesh != (aiMesh *)0x0)) {
      if (curMat == (aiMaterial *)0x0 || curMesh == (aiMesh *)0x0) {
        pLVar13 = DefaultLogger::get();
        Logger::error(pLVar13,"IRRMESH: A buffer must contain a mesh and a material");
        releaseMaterial(&curMat);
        releaseMesh(&curMesh);
      }
      else {
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&materials,&curMat);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&curMesh);
      }
      curMat = (aiMaterial *)0x0;
      curMesh = (aiMesh *)0x0;
      if (curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        curBitangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             curBitangents.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    iVar8 = (*this_02->reader->_vptr_IIrrXMLReader[0xd])();
    iVar8 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar8),"material");
    if (iVar8 == 0) {
      if (curMat != (aiMaterial *)0x0) {
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"IRRMESH: Only one material description per buffer, please");
        releaseMaterial(&curMat);
      }
      curMat = IrrlichtBase::ParseMaterial(this_02,&curMatFlags);
    }
    iVar8 = (*this_02->reader->_vptr_IIrrXMLReader[0xd])();
    iVar8 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_02,iVar8),"vertices");
    pp_Var2 = this_02->reader->_vptr_IIrrXMLReader;
    if (iVar8 == 0) {
      iVar7 = (*pp_Var2[9])(this_02->reader,"vertexCount");
      if (iVar7 != 0) goto LAB_00415279;
      pLVar13 = DefaultLogger::get();
      Logger::warn(pLVar13,"IRRMESH: Found mesh with zero vertices");
      releaseMaterial(&curMat);
      releaseMesh(&curMesh);
      iVar7 = 0;
      goto LAB_00414903;
    }
    iVar8 = (*pp_Var2[0xd])();
    iVar9 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_03,iVar8),"indices");
    iVar8 = local_1f4;
    if (iVar9 != 0) goto LAB_004148ff;
    if ((curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (curMat != (aiMaterial *)0x0)) {
      releaseMaterial(&curMat);
      pDVar19 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&idx,"IRRMESH: indices must come after vertices",(allocator *)&local_218)
      ;
      DeadlyImportError::DeadlyImportError(pDVar19,(string *)&idx);
      __cxa_throw(pDVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar14 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(paVar14);
    curMesh = paVar14;
    uVar10 = (*this_02->reader->_vptr_IIrrXMLReader[9])();
    curMesh->mNumVertices = uVar10;
    uVar10 = curMesh->mNumVertices;
    if (uVar10 == 0) {
      pLVar13 = DefaultLogger::get();
      Logger::warn(pLVar13,"IRRMESH: Found mesh with zero indices");
      releaseMesh(&curMesh);
      releaseMaterial(&curMat);
      iVar7 = 0;
      goto LAB_00414903;
    }
    if (uVar10 % 3 != 0) {
      pLVar13 = DefaultLogger::get();
      Logger::warn(pLVar13,"IRRMESH: Number if indices isn\'t divisible by 3");
      uVar10 = curMesh->mNumVertices;
    }
    paVar14 = curMesh;
    uVar23 = (ulong)uVar10 / 3;
    curMesh->mNumFaces = (uint)uVar23;
    puVar15 = (ulong *)operator_new__(uVar23 * 0x10 + 8);
    paVar5 = curMesh;
    *puVar15 = uVar23;
    paVar21 = (aiFace *)(puVar15 + 1);
    if (2 < uVar10) {
      paVar20 = paVar21;
      do {
        paVar20->mNumIndices = 0;
        paVar20->mIndices = (uint *)0x0;
        paVar20 = paVar20 + 1;
      } while (paVar20 != paVar21 + uVar23);
    }
    paVar14->mFaces = paVar21;
    paVar14->mMaterialIndex =
         (uint)((ulong)((long)materials.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)materials.
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
    paVar14->mPrimitiveTypes = 4;
    uVar10 = curMesh->mNumVertices;
    uVar23 = (ulong)uVar10 * 0xc;
    paVar16 = (aiVector3D *)operator_new__(uVar23);
    if (uVar10 != 0) {
      uVar23 = uVar23 - 0xc;
      memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
    }
    paVar5->mVertices = paVar16;
    lVar27 = (long)curVertices.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)curVertices.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_1e8 = (aiColor4D *)(lVar27 / 0xc);
    if ((long)curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar27) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar5->mNormals = paVar16;
    }
    if ((long)curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start == lVar27) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar5->mTangents = paVar16;
    }
    if ((long)curBitangents.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)curBitangents.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start == lVar27) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar5->mBitangents = paVar16;
    }
    if (((aiColor4D *)
         ((long)curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4) == local_1e8) &&
       ((local_1f0 & 1) != 0)) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 << 4;
      __s = (aiColor4D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        memset(__s,0,uVar23);
      }
      paVar5->mColors[0] = __s;
    }
    if ((long)curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar27) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar5->mTextureCoords[0] = paVar16;
    }
    iVar7 = 2;
    iVar8 = local_1f4;
    if ((long)curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar27) {
      uVar10 = paVar5->mNumVertices;
      uVar23 = (ulong)uVar10 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar23);
      if (uVar10 != 0) {
        uVar23 = uVar23 - 0xc;
        memset(paVar16,0,(uVar23 - uVar23 % 0xc) + 0xc);
      }
      paVar5->mTextureCoords[1] = paVar16;
      iVar7 = 2;
      iVar8 = local_1f4;
    }
  } while( true );
LAB_0041539f:
  bVar6 = SkipSpacesAndLineEnd<char>(&sz);
  if (!bVar6) goto LAB_004155b6;
  if (paVar20 <= paVar21) {
    pLVar13 = DefaultLogger::get();
    Logger::error(pLVar13,"IRRMESH: Too many indices");
    goto LAB_004155b6;
  }
  if (uVar10 == 0) {
    paVar21->mNumIndices = 3;
    puVar17 = (uint *)operator_new__(0xc);
    paVar21->mIndices = puVar17;
  }
  uVar11 = strtoul10(sz,&sz);
  if ((ulong)(((long)curVertices.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)curVertices.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc) <= (ulong)uVar11) {
    pLVar13 = DefaultLogger::get();
    uVar11 = 0;
    Logger::error(pLVar13,"IRRMESH: Index out of range");
  }
  paVar21->mIndices[uVar10] = local_1dc;
  paVar24->z = curVertices.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11].z;
  fVar28 = curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar11].y;
  paVar24->x = curVertices.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11].x;
  paVar24->y = fVar28;
  if (paVar16 == (aiVector3D *)0x0) {
    paVar16 = (aiVector3D *)0x0;
  }
  else {
    paVar16->z = curNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].z;
    fVar28 = curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11].y;
    paVar16->x = curNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].x;
    paVar16->y = fVar28;
    paVar16 = paVar16 + 1;
  }
  if (paVar26 == (aiVector3D *)0x0) {
    paVar26 = (aiVector3D *)0x0;
  }
  else {
    paVar26->z = curTangents.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].z;
    fVar28 = curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11].y;
    paVar26->x = curTangents.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].x;
    paVar26->y = fVar28;
    paVar26 = paVar26 + 1;
  }
  if (paVar25 == (aiVector3D *)0x0) {
    paVar25 = (aiVector3D *)0x0;
  }
  else {
    paVar25->z = curBitangents.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].z;
    fVar28 = curBitangents.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11].y;
    paVar25->x = curBitangents.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].x;
    paVar25->y = fVar28;
    paVar25 = paVar25 + 1;
  }
  if (local_1e8 == (aiColor4D *)0x0) {
    local_1e8 = (aiColor4D *)0x0;
  }
  else {
    paVar1 = curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar11;
    fVar28 = paVar1->g;
    fVar3 = paVar1->b;
    fVar4 = paVar1->a;
    local_1e8->r = paVar1->r;
    local_1e8->g = fVar28;
    local_1e8->b = fVar3;
    local_1e8->a = fVar4;
    local_1e8 = local_1e8 + 1;
  }
  if (local_190 == (aiVector3D *)0x0) {
    local_190 = (aiVector3D *)0x0;
  }
  else {
    local_190->z = curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].z;
    fVar28 = curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11].y;
    local_190->x = curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].x;
    local_190->y = fVar28;
    local_190 = local_190 + 1;
  }
  if (local_198 == (aiVector3D *)0x0) {
    local_198 = (aiVector3D *)0x0;
  }
  else {
    local_198->z = curUV2s.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11].z;
    fVar28 = curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11].y;
    local_198->x = curUV2s.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11].x;
    local_198->y = fVar28;
    local_198 = local_198 + 1;
  }
  paVar24 = paVar24 + 1;
  uVar10 = uVar10 + 1;
  bVar6 = uVar10 == 3;
  if (bVar6) {
    uVar10 = 0;
  }
  paVar21 = paVar21 + bVar6;
  local_1dc = local_1dc + 1;
  goto LAB_0041539f;
LAB_004155b6:
  if (paVar21 != paVar20) {
    pLVar13 = DefaultLogger::get();
    Logger::error(pLVar13,"IRRMESH: Not enough indices");
  }
  iVar7 = 0;
  iVar8 = local_1f4;
  if (((curMatFlags & 1) != 0) && ((local_1f0 & 1) == 0)) {
    iVar7 = 0;
    aiMaterial::AddProperty
              (curMat,&(curColors.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->a,1,"$mat.opacity",0,0);
    iVar8 = local_1f4;
  }
  goto LAB_004148ff;
LAB_00414bfa:
  do {
    SkipSpacesAndLineEnd<char>(&sz);
    local_218.x = 0.0;
    local_218.y = 0.0;
    local_218.z = 0.0;
    _idx = (pointer)0x0;
    sStack_c0 = 0;
    sz = fast_atoreal_move<float>(sz,&local_218.x,true);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,out,true);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,&local_218.z,true);
    SkipSpaces<char>(&sz);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&curVertices,&local_218);
    sz = fast_atoreal_move<float>(sz,&local_218.x,true);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,out,true);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,&local_218.z,true);
    SkipSpaces<char>(&sz);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&curNormals,&local_218);
    uVar10 = strtoul16(sz,&sz);
    ColorFromARGBPacked(uVar10,(aiColor4t<float> *)&idx);
    if (curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar6 = aiColor4t<float>::operator!=
                        ((aiColor4t<float> *)&idx,
                         curColors.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -1);
      local_1f0 = local_1f0 & 0xff;
      if (bVar6) {
        local_1f0 = 1;
      }
    }
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              (&curColors,(aiColor4t<float> *)&idx);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,&local_218.x,true);
    SkipSpaces<char>(&sz);
    sz = fast_atoreal_move<float>(sz,out,true);
    SkipSpaces<char>(&sz);
    local_218.z = 0.0;
    local_218.y = 1.0 - local_218.y;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&curUVs,&local_218);
    if (local_1f4 == 2) {
      sz = fast_atoreal_move<float>(sz,&local_218.x,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&local_218.z,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,out,true);
      SkipSpaces<char>(&sz);
      local_218._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&curTangents,&local_218);
      sz = fast_atoreal_move<float>(sz,&local_218.x,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&local_218.z,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,out,true);
      SkipSpaces<char>(&sz);
      fVar28 = -local_218.y;
      this_01 = &curBitangents;
LAB_00414f25:
      local_218.y = fVar28;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (this_01,&local_218);
    }
    else if (local_1f4 == 1) {
      sz = fast_atoreal_move<float>(sz,&local_218.x,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,out,true);
      fVar28 = 1.0 - local_218.y;
      this_01 = &curUV2s;
      goto LAB_00414f25;
    }
    bVar6 = SkipLine<char>(&sz);
  } while (bVar6);
  iVar7 = 0;
  iVar8 = local_1f4;
  goto LAB_004148ff;
LAB_00415279:
  __n = (size_type)iVar7;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&curVertices,__n);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&curNormals,__n);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&curColors,__n);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&curUVs,__n);
  iVar7 = (*this_02->reader->_vptr_IIrrXMLReader[8])(this_02->reader,"type");
  s2 = (char *)CONCAT44(extraout_var_05,iVar7);
  iVar7 = ASSIMP_stricmp("2tcoords",s2);
  if (iVar7 != 0) {
    iVar7 = ASSIMP_stricmp("tangents",s2);
    if (iVar7 == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&curTangents,__n)
      ;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&curBitangents,__n);
      iVar7 = 1;
      iVar8 = 2;
    }
    else {
      iVar9 = ASSIMP_stricmp("standard",s2);
      iVar7 = 1;
      iVar8 = 0;
      if (iVar9 != 0) {
        releaseMaterial(&curMat);
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"IRRMESH: Unknown vertex format");
        iVar7 = 1;
        iVar8 = local_1f4;
      }
    }
    goto LAB_004148ff;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&curUV2s,__n);
  iVar7 = 1;
  iVar8 = 1;
  if ((curMatFlags >> 0x14 & 1) == 0) goto LAB_004148ff;
  idx = 1;
  uVar10 = 0;
  if ((curMatFlags & 2) == 0) {
    uVar11 = 6;
    if ((curMatFlags >> 8 & 1) == 0) {
      uVar11 = 1;
      uVar10 = 1;
      if ((curMatFlags >> 0x10 & 1) == 0) goto LAB_004156cf;
    }
  }
  else {
    uVar11 = 10;
  }
  aiMaterial::AddProperty(curMat,&idx,1,"$tex.uvwsrc",uVar11,uVar10);
LAB_004156cf:
  iVar8 = 1;
  goto LAB_004148ff;
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}